

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Parser.h
# Opt level: O1

Statement * __thiscall soul::StructuralParser::parseWhileLoop(StructuralParser *this)

{
  LoopStatement *pLVar1;
  Expression *pEVar2;
  Block *pBVar3;
  Context local_30;
  
  local_30.location.sourceCode.object = (this->super_SOULTokeniser).location.sourceCode.object;
  if (local_30.location.sourceCode.object != (SourceCodeText *)0x0) {
    ((local_30.location.sourceCode.object)->super_RefCountedObject).refCount =
         ((local_30.location.sourceCode.object)->super_RefCountedObject).refCount + 1;
  }
  local_30.location.location.data = (this->super_SOULTokeniser).location.location.data;
  local_30.parentScope = this->currentScope;
  pLVar1 = PoolAllocator::allocate<soul::AST::LoopStatement,soul::AST::Context>
                     (&this->allocator->pool,&local_30);
  RefCountedPtr<soul::SourceCodeText>::decIfNotNull(local_30.location.sourceCode.object);
  Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
  ::expect<soul::TokenType>(&this->super_SOULTokeniser,(TokenType)0x288ebc);
  pEVar2 = parseExpression(this,false);
  Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
  ::expect<soul::TokenType>(&this->super_SOULTokeniser,(TokenType)0x286aae);
  (pLVar1->condition).object = pEVar2;
  pBVar3 = parseStatementAsNewBlock(this);
  (pLVar1->body).object = &pBVar3->super_Statement;
  return &pLVar1->super_Statement;
}

Assistant:

AST::Statement& parseWhileLoop()
    {
        auto& loopStatement = allocate<AST::LoopStatement> (getContext());

        expect (Operator::openParen);
        loopStatement.condition = matchCloseParen (parseExpression());
        loopStatement.body = parseStatementAsNewBlock();

        return loopStatement;
    }